

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.h
# Opt level: O2

InlineRep * __thiscall
absl::lts_20240722::Cord::InlineRep::operator=(InlineRep *this,InlineRep *src)

{
  CordRep *pCVar1;
  
  if (((this->data_).rep_.field_0.data[0] & 1U) != 0) {
    absl::lts_20240722::Cord::InlineRep::UnrefTree();
  }
  pCVar1 = (src->data_).rep_.field_0.as_tree.rep;
  (this->data_).rep_.field_0.as_tree.cordz_info = (src->data_).rep_.field_0.as_tree.cordz_info;
  (this->data_).rep_.field_0.as_tree.rep = pCVar1;
  (src->data_).rep_.field_0.as_tree.cordz_info = 0;
  (src->data_).rep_.field_0.as_tree.rep = (CordRep *)0x0;
  return this;
}

Assistant:

inline Cord::InlineRep& Cord::InlineRep::operator=(
    Cord::InlineRep&& src) noexcept {
  if (is_tree()) {
    UnrefTree();
  }
  data_ = src.data_;
  src.ResetToEmpty();
  return *this;
}